

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O0

void __thiscall
booster::hold_ptr<booster::log::sinks::syslog::data>::~hold_ptr
          (hold_ptr<booster::log::sinks::syslog::data> *this)

{
  void *pvVar1;
  long *in_RDI;
  
  if ((*in_RDI != 0) && (pvVar1 = (void *)*in_RDI, pvVar1 != (void *)0x0)) {
    log::sinks::syslog::data::~data((data *)0x223c84);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}